

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

size_t mbedtls_ssl_get_current_mtu(mbedtls_ssl_context *ssl)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  
  if ((ssl->conf->endpoint == '\0') && (ssl->state - 1U < 2)) {
    uVar3 = 0;
  }
  else {
    if (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) {
      uVar1 = ssl->handshake->mtu;
      if (uVar1 != 0) {
        uVar2 = ssl->mtu;
        uVar3 = (uint)uVar1;
        if ((uVar2 != 0) && (uVar2 < uVar1)) {
          uVar3 = (uint)uVar2;
        }
        goto LAB_0018af22;
      }
    }
    uVar3 = (uint)ssl->mtu;
  }
LAB_0018af22:
  return (ulong)uVar3;
}

Assistant:

size_t mbedtls_ssl_get_current_mtu(const mbedtls_ssl_context *ssl)
{
    /* Return unlimited mtu for client hello messages to avoid fragmentation. */
    if (ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT &&
        (ssl->state == MBEDTLS_SSL_CLIENT_HELLO ||
         ssl->state == MBEDTLS_SSL_SERVER_HELLO)) {
        return 0;
    }

    if (ssl->handshake == NULL || ssl->handshake->mtu == 0) {
        return ssl->mtu;
    }

    if (ssl->mtu == 0) {
        return ssl->handshake->mtu;
    }

    return ssl->mtu < ssl->handshake->mtu ?
           ssl->mtu : ssl->handshake->mtu;
}